

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.cpp
# Opt level: O3

void __thiscall RVO::Agent::insertAgentNeighbor(Agent *this,Agent *agent,float *rangeSq)

{
  iterator __position;
  ulong uVar1;
  pointer ppVar2;
  pointer ppVar3;
  long lVar4;
  Agent **ppAVar5;
  float fVar6;
  float fVar7;
  pair<float,_const_RVO::Agent_*> local_28;
  
  if ((this != agent) &&
     (fVar7 = (this->position_).x_ - (agent->position_).x_,
     fVar6 = (this->position_).y_ - (agent->position_).y_, fVar6 = fVar7 * fVar7 + fVar6 * fVar6,
     fVar6 < *rangeSq)) {
    ppVar3 = (this->agentNeighbors_).
             super__Vector_base<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    __position._M_current =
         (this->agentNeighbors_).
         super__Vector_base<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    uVar1 = (long)__position._M_current - (long)ppVar3 >> 4;
    if (uVar1 < this->maxNeighbors_) {
      if (__position._M_current ==
          (this->agentNeighbors_).
          super__Vector_base<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_28.first = fVar6;
        local_28.second = agent;
        std::
        vector<std::pair<float,RVO::Agent_const*>,std::allocator<std::pair<float,RVO::Agent_const*>>>
        ::_M_realloc_insert<std::pair<float,RVO::Agent_const*>>
                  ((vector<std::pair<float,RVO::Agent_const*>,std::allocator<std::pair<float,RVO::Agent_const*>>>
                    *)this,__position,&local_28);
        ppVar2 = (this->agentNeighbors_).
                 super__Vector_base<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        *(ulong *)__position._M_current = CONCAT44(local_28._4_4_,fVar6);
        (__position._M_current)->second = agent;
        ppVar2 = (this->agentNeighbors_).
                 super__Vector_base<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
        (this->agentNeighbors_).
        super__Vector_base<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppVar2;
      }
      ppVar3 = (this->agentNeighbors_).
               super__Vector_base<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar1 = (long)ppVar2 - (long)ppVar3 >> 4;
    }
    lVar4 = uVar1 - 1;
    if (lVar4 != 0) {
      ppAVar5 = &ppVar3[uVar1 - 1].second;
      do {
        if (*(float *)(ppAVar5 + -3) <= fVar6) goto LAB_00106a28;
        ((pair<float,_const_RVO::Agent_*> *)(ppAVar5 + -1))->first = *(float *)(ppAVar5 + -3);
        *ppAVar5 = ppAVar5[-2];
        ppAVar5 = ppAVar5 + -2;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
    }
    lVar4 = 0;
LAB_00106a28:
    ppVar3[lVar4].first = fVar6;
    ppVar3[lVar4].second = agent;
    if (uVar1 == this->maxNeighbors_) {
      *rangeSq = (this->agentNeighbors_).
                 super__Vector_base<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].first;
    }
  }
  return;
}

Assistant:

void Agent::insertAgentNeighbor(const Agent *agent, float &rangeSq)
	{
		if (this != agent) {
			const float distSq = absSq(position_ - agent->position_);

			if (distSq < rangeSq) {
				if (agentNeighbors_.size() < maxNeighbors_) {
					agentNeighbors_.push_back(std::make_pair(distSq, agent));
				}

				size_t i = agentNeighbors_.size() - 1;

				while (i != 0 && distSq < agentNeighbors_[i - 1].first) {
					agentNeighbors_[i] = agentNeighbors_[i - 1];
					--i;
				}

				agentNeighbors_[i] = std::make_pair(distSq, agent);

				if (agentNeighbors_.size() == maxNeighbors_) {
					rangeSq = agentNeighbors_.back().first;
				}
			}
		}
	}